

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::simplify
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  element_type *peVar5;
  undefined4 extraout_var_01;
  undefined8 extraout_XMM0_Qa;
  double s_;
  double s__00;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  peVar4 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->expr_);
  uVar1 = (*peVar4->_vptr_rt_expression_interface[8])();
  if ((uVar1 & 1) == 0) {
    this_local = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18);
    peVar4 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->expr_);
    iVar2 = (*peVar4->_vptr_rt_expression_interface[0x10])();
    peVar5 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>
             ::operator->(&this->op_);
    iVar3 = (*peVar5->_vptr_op_interface[2])();
    rt_unary_expr(this_local,(rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2),
                  (op_interface_type *)CONCAT44(extraout_var_01,iVar3));
  }
  else {
    peVar5 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>
             ::operator->(&this->op_);
    uVar1 = (*peVar5->_vptr_op_interface[10])();
    if ((uVar1 & 1) == 0) {
      this_local = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18)
      ;
      this_00 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
                operator_new(0x10);
      peVar4 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->expr_)
      ;
      (*peVar4->_vptr_rt_expression_interface[9])();
      rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(this_00,s__00);
      peVar5 = std::
               auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
               operator->(&this->op_);
      iVar2 = (*peVar5->_vptr_op_interface[2])();
      rt_unary_expr(this_local,(rt_expression_interface<double> *)this_00,
                    (op_interface_type *)CONCAT44(extraout_var,iVar2));
    }
    else {
      this_local = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x10)
      ;
      peVar5 = std::
               auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
               operator->(&this->op_);
      peVar4 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->expr_)
      ;
      (*peVar4->_vptr_rt_expression_interface[9])();
      (*peVar5->_vptr_op_interface[4])(extraout_XMM0_Qa);
      rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
                ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)this_local,s_)
      ;
    }
  }
  return &this_local->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * simplify() const
      {
        if (expr_->is_constant())
        {
          if (op_->can_simplify())
            return new rt_constant<numeric_type, InterfaceType>( op_->apply(expr_->unwrap()) );
          else
            return new rt_unary_expr(new rt_constant<numeric_type, InterfaceType>(expr_->unwrap()),
                                     op_->clone());
        }

        //TODO: Unwrap op_id()

        return new rt_unary_expr(expr_->simplify(), op_->clone());
      }